

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.h
# Opt level: O0

void __thiscall
cnn::LookupParameters::load<boost::archive::text_iarchive>
          (LookupParameters *this,text_iarchive *ar,uint param_3)

{
  size_type sVar1;
  interface_iarchive<boost::archive::text_iarchive> *this_00;
  interface_iarchive<boost::archive::text_iarchive> *piVar2;
  Tensor *in_RSI;
  long in_RDI;
  uint i;
  int nv;
  Dim *in_stack_ffffffffffffffc8;
  Tensor *t;
  interface_iarchive<boost::archive::text_iarchive> *in_stack_ffffffffffffffd0;
  uint local_1c;
  int local_18;
  
  boost::archive::detail::interface_iarchive<boost::archive::text_iarchive>::operator&
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  boost::archive::detail::interface_iarchive<boost::archive::text_iarchive>::operator&
            (in_stack_ffffffffffffffd0,(int *)in_stack_ffffffffffffffc8);
  sVar1 = std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::size
                    ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)(in_RDI + 0x30));
  if (local_18 == (int)sVar1) {
    local_1c = 0;
    while( true ) {
      this_00 = (interface_iarchive<boost::archive::text_iarchive> *)(ulong)local_1c;
      piVar2 = (interface_iarchive<boost::archive::text_iarchive> *)
               std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::size
                         ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)(in_RDI + 0x30));
      if (piVar2 <= this_00) break;
      t = in_RSI;
      std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)(in_RDI + 0x30),
                 (ulong)local_1c);
      boost::archive::detail::interface_iarchive<boost::archive::text_iarchive>::operator&
                (this_00,t);
      local_1c = local_1c + 1;
    }
    return;
  }
  __assert_fail("nv == (int)values.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/model.h"
                ,0x5d,
                "void cnn::LookupParameters::load(Archive &, const unsigned int) [Archive = boost::archive::text_iarchive]"
               );
}

Assistant:

void load(Archive& ar, const unsigned int) {
    ar & dim;
    int nv;
    ar & nv;
    assert(nv == (int)values.size());
    for (unsigned i = 0; i < values.size(); ++i)
      ar & values[i];
  }